

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O1

void printAnswerForDebug(myRep *rep)

{
  int iVar1;
  _List_node_base *p_Var2;
  char *__filename;
  FILE *__stream;
  ostream *poVar3;
  _List_node_base *p_Var4;
  int ss;
  ulong uVar5;
  long lVar6;
  
  p_Var4 = (rep->super__List_base<Rep,_std::allocator<Rep>_>)._M_impl._M_node.super__List_node_base.
           _M_next;
  if (p_Var4 != (_List_node_base *)rep) {
    ss = 0;
    do {
      __filename = catStrIntStr(draftAddress,"rep",ss,".txt");
      __stream = fopen(__filename,"w");
      if (__stream == (FILE *)0x0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Can\'t print rep answer");
        std::endl<char,std::char_traits<char>>(poVar3);
        exit(-1);
      }
      fprintf(__stream,"iterator=%d\n",(ulong)*(uint *)((long)(p_Var4 + 1 + 1) + 0xc));
      fprintf(__stream,"cost0 =%10.3f cost1 =%10.3f\n",(p_Var4[1]._M_next)->_M_next,
              (p_Var4[1]._M_next)->_M_prev);
      iVar1 = *(int *)((long)(p_Var4 + 1 + 1) + 8);
      if (0 < iVar1) {
        lVar6 = 0;
        uVar5 = 0;
        do {
          fprintf(__stream,"%4d ",uVar5);
          fwrite((&PTR_anon_var_dwarf_3cc1_00108d58)[(uint)uVar5 & 3],4,1,__stream);
          p_Var2 = p_Var4[1]._M_prev;
          fprintf(__stream,"%8.3f %8.3f %8.3f\n",(&p_Var2->_M_next)[lVar6],(&p_Var2->_M_prev)[lVar6]
                  ,(&p_Var2[1]._M_next)[lVar6]);
          uVar5 = (ulong)((uint)uVar5 + 1);
          lVar6 = lVar6 + 3;
        } while ((int)lVar6 < iVar1);
      }
      ss = ss + 1;
      fclose(__stream);
      p_Var4 = (((_List_base<Rep,_std::allocator<Rep>_> *)&p_Var4->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)rep);
  }
  return;
}

Assistant:

void printAnswerForDebug(myRep & rep){
    myRep ::iterator it1;
    int k=0;
    for (it1=rep.begin(); it1!= rep.end(); it1++){
        char *filename;
        filename = catStrIntStr(draftAddress, "rep", k, ".txt");
        FILE *outFile;
        outFile = fopen(filename, "w");
        if (outFile == NULL) {
            cout << "Can't print rep answer" << endl;
            exit(-1);
        }
        fprintf(outFile, "iterator=%d\n",it1->iterator);
        fprintf(outFile, "cost0 =%10.3f cost1 =%10.3f\n", it1->Cost[0], it1->Cost[1]);
        int len = it1->sizeOfAddO_origin;
        int t=0;
        for (int j=0; j<len; j+=3){
            fprintf(outFile, "%4d ", t);
            switch (t % 4){
                case 0: fprintf(outFile, " N  "); break;
                case 1: fprintf(outFile, " CA "); break;
                case 2: fprintf(outFile, " C  "); break;
                case 3: fprintf(outFile, " O  "); break;
            }
            fprintf(outFile, "%8.3f %8.3f %8.3f\n",
                    it1->addO_origin[j], it1->addO_origin[j+1], it1->addO_origin[j+2]);
            t++;
        }
        k++;
        fclose(outFile);
    }
}